

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O2

Expression * wasm::Properties::getAlmostSignExt(Expression *curr)

{
  bool bVar1;
  Index IVar2;
  Index IVar3;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_108;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>
  local_c8;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_88;
  Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
  local_60;
  Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_> local_38;
  Expression *local_28;
  Expression *extended;
  int32_t leftShift;
  int32_t rightShift;
  
  local_108.submatchers.curr.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::AnyKind<int>_> *)&extended;
  extended._0_4_ = 0;
  local_c8.submatchers.curr.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::AnyKind<int>_> *)((long)&extended + 4);
  extended._4_4_ = 0;
  local_38.binder = &local_28;
  local_28 = (Expression *)0x0;
  local_60.submatchers.next.curr = &local_108;
  local_108.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_108.binder = (matched_t<wasm::Const_*> *)0x0;
  local_88.submatchers.curr = &local_60;
  local_60.binder =
       (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
  local_60.submatchers.curr = &local_38;
  local_60.data = ShlInt32;
  local_88.submatchers.next.curr = &local_c8;
  local_c8.submatchers.curr.binder =
       (matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>_> *)0x0;
  local_c8.binder = (matched_t<wasm::Const_*> *)0x0;
  local_88.binder =
       (matched_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>_> *)0x0;
  local_88.data = ShrSInt32;
  bVar1 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::BinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<int>_>_>_>_&>
          ::matches(&local_88,curr);
  if (bVar1) {
    IVar2 = Bits::getEffectiveShifts(extended._4_4_,(Type)0x2);
    IVar3 = Bits::getEffectiveShifts((Index)extended,(Type)0x2);
    if ((IVar2 <= IVar3) && (extended._4_4_ != 0)) {
      return local_28;
    }
  }
  return (Expression *)0x0;
}

Assistant:

inline Expression* getAlmostSignExt(Expression* curr) {
  using namespace Match;
  int32_t leftShift = 0, rightShift = 0;
  Expression* extended = nullptr;
  if (matches(curr,
              binary(ShrSInt32,
                     binary(ShlInt32, any(&extended), i32(&leftShift)),
                     i32(&rightShift))) &&
      Bits::getEffectiveShifts(rightShift, Type::i32) <=
        Bits::getEffectiveShifts(leftShift, Type::i32) &&
      rightShift != 0) {
    return extended;
  }
  return nullptr;
}